

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpd.cpp
# Opt level: O0

int main(void)

{
  anon_class_1_0_00000001 local_1b1;
  BoolFunctor local_1b0;
  allocator local_189;
  string local_188 [39];
  allocator local_161;
  string local_160;
  undefined1 local_140 [24];
  string local_128;
  undefined1 local_108 [8];
  HttpServer httpd;
  allocator local_c1;
  string local_c0;
  undefined1 local_a0 [8];
  EventLoopGroup group;
  
  group.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"EPOLL",&local_c1);
  Liby::EventLoopGroup::EventLoopGroup((EventLoopGroup *)local_a0,0,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,"/home/ccsexyz",(allocator *)(local_140 + 0x17))
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_160,"localhost",&local_161);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_188,"8080",&local_189);
  Liby::EventLoopGroup::creatTcpServer((EventLoopGroup *)local_140,(string *)local_a0,&local_160);
  Liby::http::HttpServer::HttpServer
            ((HttpServer *)local_108,&local_128,(shared_ptr<Liby::TcpServer> *)local_140);
  std::shared_ptr<Liby::TcpServer>::~shared_ptr((shared_ptr<Liby::TcpServer> *)local_140);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)(local_140 + 0x17));
  std::function<bool()>::
  function<Liby::EventLoopGroup::run(std::function<bool()>)::_default_arg_1_::_lambda()_1_,void>
            ((function<bool()> *)&local_1b0,&local_1b1);
  Liby::EventLoopGroup::run((EventLoopGroup *)local_a0,&local_1b0);
  std::function<bool_()>::~function(&local_1b0);
  group.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  Liby::http::HttpServer::~HttpServer((HttpServer *)local_108);
  Liby::EventLoopGroup::~EventLoopGroup((EventLoopGroup *)local_a0);
  return group.threads_.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_;
}

Assistant:

int main(void) {
    EventLoopGroup group;
    HttpServer httpd("/home/ccsexyz",
                     group.creatTcpServer("localhost", "8080"));
    group.run();
    return 0;
}